

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint32 tag,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  undefined1 local_50 [8];
  ExtensionInfo extension;
  int number;
  bool was_packed_on_wire;
  
  bVar1 = FindExtensionInfoFromTag
                    (this,tag,extension_finder,(int *)&extension.descriptor,
                     (ExtensionInfo *)local_50,(bool *)((long)&extension.descriptor + 7));
  if (bVar1) {
    uVar2 = ParseFieldWithExtensionInfo
                      (this,(int)extension.descriptor,(bool)extension.descriptor._7_1_,
                       (ExtensionInfo *)local_50,input,field_skipper);
  }
  else {
    iVar3 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)tag);
    uVar2 = (undefined1)iVar3;
  }
  return (bool)uVar2;
}

Assistant:

bool ExtensionSet::ParseField(uint32 tag, io::CodedInputStream* input,
                              ExtensionFinder* extension_finder,
                              FieldSkipper* field_skipper) {
  int number;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromTag(tag, extension_finder, &number, &extension,
                                &was_packed_on_wire)) {
    return field_skipper->SkipField(input, tag);
  } else {
    return ParseFieldWithExtensionInfo(number, was_packed_on_wire, extension,
                                       input, field_skipper);
  }
}